

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_sign_custom
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_schnorrsig_extraparams *extraparams)

{
  secp256k1_fe *r;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  secp256k1_gej *r_00;
  uint uVar3;
  uchar *msg_00;
  uchar *data;
  secp256k1_gej *data_00;
  long lVar4;
  void *ndata;
  secp256k1_scalar *psVar5;
  secp256k1_fe *r_01;
  secp256k1_nonce_function_hardened noncefp;
  uchar auStackY_988 [32];
  secp256k1_sha256 sStackY_968;
  secp256k1_fe *psStackY_8f8;
  secp256k1_scalar *psStackY_8f0;
  uchar *puStackY_8e8;
  secp256k1_gej *psStackY_8e0;
  code *pcStackY_8d8;
  uint uStackY_8cc;
  size_t sStackY_8c8;
  uint uStackY_8bc;
  secp256k1_fe sStackY_8b8;
  secp256k1_strauss_state sStackY_888;
  uchar auStackY_870 [40];
  secp256k1_ge sStackY_848;
  secp256k1_gej sStackY_7e0;
  secp256k1_gej sStackY_748;
  secp256k1_fe asStackY_6b0 [4];
  undefined1 auStackY_5f0 [92];
  int iStackY_594;
  int iStackY_590;
  secp256k1_ge asStackY_1e0 [4];
  
  if (ctx != (secp256k1_context *)0x0) {
    if (extraparams == (secp256k1_schnorrsig_extraparams *)0x0) {
      noncefp = (secp256k1_nonce_function_hardened)0x0;
      ndata = (void *)0x0;
    }
    else {
      lVar4 = 0;
      do {
        if (extraparams->magic[lVar4] != schnorrsig_extraparams_magic[lVar4]) {
          (*(ctx->illegal_callback).fn)
                    ("secp256k1_memcmp_var(extraparams->magic, schnorrsig_extraparams_magic, sizeof(extraparams->magic)) == 0"
                     ,(ctx->illegal_callback).data);
          return 0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      noncefp = extraparams->noncefp;
      ndata = extraparams->ndata;
    }
    iVar2 = secp256k1_schnorrsig_sign_internal(ctx,sig64,msg,msglen,keypair,noncefp,ndata);
    return iVar2;
  }
  secp256k1_schnorrsig_sign_custom_cold_1();
  if (ctx == (secp256k1_context *)0x0) {
    pcStackY_8d8 = (code *)0x10f3bb;
    secp256k1_schnorrsig_verify_cold_5();
  }
  else if (sig64 != (uchar *)0x0) {
    if (msglen != 0 && msg_00 == (uchar *)0x0) {
      pcStackY_8d8 = (code *)0x10f3cd;
      secp256k1_schnorrsig_verify_cold_3();
      return 0;
    }
    if (keypair == (secp256k1_keypair *)0x0) {
      pcStackY_8d8 = (code *)0x10f3d7;
      secp256k1_schnorrsig_verify_cold_2();
      return 0;
    }
    pcStackY_8d8 = (code *)0x10f1c5;
    secp256k1_fe_impl_set_b32_mod(&sStackY_8b8,sig64);
    if (((0xffffefffffc2e < sStackY_8b8.n[0]) && (sStackY_8b8.n[4] == 0xffffffffffff)) &&
       ((sStackY_8b8.n[2] & sStackY_8b8.n[3] & sStackY_8b8.n[1]) == 0xfffffffffffff)) {
      return 0;
    }
    sStackY_8b8.magnitude = 1;
    sStackY_8b8.normalized = 1;
    pcStackY_8d8 = (code *)0x10f223;
    sStackY_8c8 = msglen;
    secp256k1_fe_verify(&sStackY_8b8);
    bVar1 = false;
    lVar4 = 0x20;
    psVar5 = (secp256k1_scalar *)0x0;
    do {
      uVar3 = (uint)sig64[lVar4] | (int)psVar5 << 8;
      uStackY_8cc = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      if (uVar3 < 0xd) {
        uStackY_8cc = uVar3;
      }
      psVar5 = (secp256k1_scalar *)(ulong)uStackY_8cc;
      if (uVar3 >= 0xd) {
        bVar1 = true;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    pcStackY_8d8 = (code *)0x10f26b;
    secp256k1_scalar_verify(psVar5);
    if (bVar1) {
      return 0;
    }
    pcStackY_8d8 = (code *)0x10f298;
    iVar2 = secp256k1_pubkey_load(ctx,&sStackY_848,(secp256k1_pubkey *)keypair);
    if (iVar2 == 0) {
      return 0;
    }
    pcStackY_8d8 = (code *)0x10f2b1;
    secp256k1_fe_get_b32(auStackY_870,&sStackY_848.x);
    pcStackY_8d8 = (code *)0x10f2cc;
    secp256k1_schnorrsig_challenge(&uStackY_8bc,sig64,msg_00,sStackY_8c8,auStackY_870);
    pcStackY_8d8 = (code *)0x10f2d7;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStackY_8bc);
    uVar3 = 0xd - uStackY_8bc;
    if (uStackY_8bc == 0) {
      uVar3 = 0;
    }
    pcStackY_8d8 = (code *)0x10f2ec;
    uStackY_8bc = uVar3;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar3);
    r_00 = &sStackY_7e0;
    pcStackY_8d8 = (code *)0x10f304;
    secp256k1_gej_set_ge(r_00,&sStackY_848);
    sStackY_888.aux = asStackY_6b0;
    sStackY_888.pre_a = asStackY_1e0;
    sStackY_888.ps = (secp256k1_strauss_point_state *)auStackY_5f0;
    pcStackY_8d8 = (code *)0x10f34c;
    psVar5 = &uStackY_8bc;
    secp256k1_ecmult_strauss_wnaf(&sStackY_888,&sStackY_748,1,r_00,&uStackY_8bc,&uStackY_8cc);
    pcStackY_8d8 = (code *)0x10f35f;
    data_00 = &sStackY_748;
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStackY_5f0,&sStackY_748);
    pcStackY_8d8 = (code *)0x10f367;
    secp256k1_ge_verify((secp256k1_ge *)auStackY_5f0);
    if (iStackY_590 != 0) {
      return 0;
    }
    r = (secp256k1_fe *)(auStackY_5f0 + 0x30);
    pcStackY_8d8 = (code *)0x10f381;
    secp256k1_fe_normalize_var(r);
    pcStackY_8d8 = (code *)0x10f389;
    r_01 = r;
    secp256k1_fe_verify(r);
    if (iStackY_594 == 0) {
      pcStackY_8d8 = secp256k1_schnorrsig_challenge;
      secp256k1_schnorrsig_verify_cold_1();
      sStackY_968.s[0] = 0x9cecba11;
      sStackY_968.s[1] = 0x23925381;
      sStackY_968.s[2] = 0x11679112;
      sStackY_968.s[3] = 0xd1627e0f;
      sStackY_968.s[4] = 0x97c87550;
      sStackY_968.s[5] = 0x3cc765;
      sStackY_968.s[6] = 0x90f61164;
      sStackY_968.s[7] = 0x33e9b66a;
      sStackY_968.bytes = 0x40;
      psStackY_8f8 = r;
      psStackY_8f0 = &uStackY_8bc;
      puStackY_8e8 = auStackY_870;
      psStackY_8e0 = &sStackY_748;
      pcStackY_8d8 = (code *)sig64;
      secp256k1_sha256_write(&sStackY_968,(uchar *)data_00,0x20);
      secp256k1_sha256_write(&sStackY_968,(uchar *)psVar5,0x20);
      secp256k1_sha256_write(&sStackY_968,data,(size_t)r_00);
      secp256k1_sha256_finalize(&sStackY_968,auStackY_988);
      secp256k1_scalar_set_b32((secp256k1_scalar *)r_01,auStackY_988,(int *)0x0);
      return extraout_EAX;
    }
    if ((auStackY_5f0[0x30] & 1) == 0) {
      pcStackY_8d8 = (code *)0x10f3af;
      iVar2 = secp256k1_fe_equal(&sStackY_8b8,(secp256k1_fe *)auStackY_5f0);
      return iVar2;
    }
    return 0;
  }
  pcStackY_8d8 = (code *)0x10f3c3;
  secp256k1_schnorrsig_verify_cold_4();
  return 0;
}

Assistant:

int secp256k1_schnorrsig_sign_custom(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_schnorrsig_extraparams *extraparams) {
    secp256k1_nonce_function_hardened noncefp = NULL;
    void *ndata = NULL;
    VERIFY_CHECK(ctx != NULL);

    if (extraparams != NULL) {
        ARG_CHECK(secp256k1_memcmp_var(extraparams->magic,
                                       schnorrsig_extraparams_magic,
                                       sizeof(extraparams->magic)) == 0);
        noncefp = extraparams->noncefp;
        ndata = extraparams->ndata;
    }
    return secp256k1_schnorrsig_sign_internal(ctx, sig64, msg, msglen, keypair, noncefp, ndata);
}